

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtiming.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  Am_Wrapper *pAVar6;
  Am_Object *pAVar7;
  Am_Object AVar8;
  Am_Value *this;
  long lVar9;
  int iVar10;
  Am_Time stop;
  Am_Object local_60;
  Am_Object linear;
  Am_Object local_50;
  Am_Object local_48;
  Am_Time local_40 [8];
  Am_Object stepper;
  
  poVar5 = std::operator<<((ostream *)&std::cout,"Test");
  std::endl<char,std::char_traits<char>>(poVar5);
  uVar3 = 0x32;
  iVar2 = 1000;
  if ((1 < argc) && (iVar2 = atoi(argv[1]), argc != 2)) {
    uVar3 = atoi(argv[2]);
  }
  Am_Initialize();
  Am_Object::Create((char *)&linear);
  Am_Time::Am_Time(&stop);
  pAVar6 = Am_Time::operator_cast_to_Am_Wrapper_(&stop);
  uVar1 = Am_Object::Set((ushort)&linear,(Am_Wrapper *)0xe9,(ulong)pAVar6);
  uVar1 = Am_Object::Set(uVar1,0x183,1);
  pAVar7 = (Am_Object *)
           Am_Object::Set(uVar1,(Am_Method_Wrapper *)0xca,(ulong)print_elapsed_time.from_wrapper);
  Am_Object::Am_Object(&stepper,pAVar7);
  Am_Time::~Am_Time(&stop);
  Am_Object::~Am_Object(&linear);
  Am_Object::Create((char *)&stop);
  Am_Time::Am_Time((Am_Time *)&local_60);
  pAVar6 = Am_Time::operator_cast_to_Am_Wrapper_((Am_Time *)&local_60);
  uVar1 = Am_Object::Set((ushort)&stop,(Am_Wrapper *)0x101,(ulong)pAVar6);
  Am_Time::Am_Time(local_40,10000);
  pAVar6 = Am_Time::operator_cast_to_Am_Wrapper_(local_40);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0xfd,(ulong)pAVar6);
  pAVar7 = (Am_Object *)
           Am_Object::Set(uVar1,(Am_Method_Wrapper *)0xca,(ulong)print_event_count.from_wrapper);
  Am_Object::Am_Object(&linear,pAVar7);
  Am_Time::~Am_Time(local_40);
  Am_Time::~Am_Time((Am_Time *)&local_60);
  Am_Object::~Am_Object((Am_Object *)&stop);
  poVar5 = std::operator<<((ostream *)&std::cout,"Starting test animation...");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::ostream::flush();
  Am_Object::Create((char *)&stop);
  uVar1 = Am_Object::Set((ushort)&stop,0x66,100);
  AVar8.data = (Am_Object_Data *)Am_Object::Set(uVar1,0x67,100);
  Am_Object::Create((char *)&local_60);
  uVar1 = Am_Object::Set((ushort)&local_60,0x66,(ulong)uVar3);
  uVar1 = Am_Object::Set(uVar1,0x67,(ulong)uVar3);
  pAVar7 = (Am_Object *)Am_Object::Set(uVar1,100,0);
  pAVar7 = (Am_Object *)Am_Object::operator=(&goober,pAVar7);
  Am_Object::Am_Object(&local_50,pAVar7);
  pAVar7 = (Am_Object *)Am_Object::Add_Part(AVar8,SUB81(&local_50,0),1);
  Am_Object::Am_Object(&local_48,pAVar7);
  Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_48,0),1);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object((Am_Object *)&stop);
  Am_Time::Now();
  Am_Time::operator=((Am_Time *)&start,&stop);
  Am_Time::~Am_Time(&stop);
  iVar10 = 0;
  if (0 < iVar2) {
    iVar10 = iVar2;
  }
  while (iVar10 != 0) {
    this = (Am_Value *)Am_Object::Get(0x5240,100);
    iVar4 = Am_Value::operator_cast_to_int(this);
    Am_Object::Set(0x5240,100,(ulong)(uint)((int)uVar3 / 2 - iVar4));
    Am_Demon_Queue::Invoke();
    Am_Update_All();
    iVar10 = iVar10 + -1;
  }
  Am_Time::Now();
  Am_Time::operator-((Am_Time *)&local_60,&stop);
  lVar9 = Am_Time::Milliseconds();
  Am_Time::~Am_Time((Am_Time *)&local_60);
  poVar5 = std::operator<<((ostream *)&std::cout,"Redraw executed ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar2);
  poVar5 = std::operator<<(poVar5," steps in ");
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  std::operator<<(poVar5,"for average cost of ");
  poVar5 = std::ostream::_M_insert<double>((double)lVar9 / (double)iVar2);
  poVar5 = std::operator<<(poVar5," ms per iteration.");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::ostream::flush();
  poVar5 = std::operator<<((ostream *)&std::cout,"Done.");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::ostream::flush();
  Am_Cleanup();
  Am_Time::~Am_Time(&stop);
  Am_Object::~Am_Object(&linear);
  Am_Object::~Am_Object(&stepper);
  return 0;
}

Assistant:

int
main(int argc, char *argv[])
{
  std::cout << "Test" << std::endl;

  int n = argc > 1 ? atoi(argv[1]) : 1000;
  int size = argc > 2 ? atoi(argv[2]) : 50;
  //  bool use_linear = (argc > 2);

  Am_Initialize();

  Am_Object stepper = Am_Stepping_Animator.Create("stepper")
                          .Set(Am_REPEAT_DELAY, Am_Time())
                          .Set(Am_SMALL_INCREMENT, 1)
                          .Set(Am_DO_METHOD, print_elapsed_time);
  Am_Object linear = Am_Animator.Create("linear")
                         .Set(Am_MIN_REPEAT_DELAY, Am_Time())
                         .Set(Am_DURATION, Am_Time(10000))
                         .Set(Am_DO_METHOD, print_event_count);

  std::cout << "Starting test animation..." << std::endl << std::flush;
  Am_Screen.Add_Part(Am_Window.Create()
                         .Set(Am_WIDTH, 100)
                         .Set(Am_HEIGHT, 100)
                         .Add_Part(goober = Am_Rectangle.Create()
                                                .Set(Am_WIDTH, size)
                                                .Set(Am_HEIGHT, size)
                                                .Set(Am_LEFT, 0)));

  start = Am_Time::Now();

  for (int i = 0; i < n; ++i) {
    goober.Set(Am_LEFT, size / 2 - (int)goober.Get(Am_LEFT));
    Main_Demon_Queue.Invoke();
    Am_Update_All();
  }

  Am_Time stop = Am_Time::Now();

  long ms = (stop - start).Milliseconds();

  std::cout << "Redraw executed " << n << " steps in " << ms << std::endl
            << "for average cost of " << double(ms) / n << " ms per iteration."
            << std::endl
            << std::flush;

  std::cout << "Done." << std::endl << std::flush;
  Am_Cleanup();

  return 0;
}